

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

encoding_t detect_encoding(str *s)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uStack_28;
  int c;
  size_t i;
  bool anyhigh;
  str *s_local;
  
  bVar1 = 0;
  uStack_28 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar3 = std::__cxx11::string::size();
          if (uVar3 <= uStack_28) {
            return (uint)bVar1;
          }
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
          if (((int)*pcVar4 & 0x80U) != 0) break;
          uStack_28 = uStack_28 + 1;
        }
        bVar1 = 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
        if ((((int)*pcVar4 & 0xe0U) != 0xc0) ||
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s),
           ((int)*pcVar4 & 0xc0U) != 0x80)) break;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
        iVar2 = read_UTF8_ch(pcVar4);
        if (iVar2 < 0x80) {
          return ENC_SINGLE_BYTE;
        }
        uStack_28 = uStack_28 + 2;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if ((((int)*pcVar4 & 0xf0U) != 0xe0) ||
         ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s),
          ((int)*pcVar4 & 0xc0U) != 0x80 ||
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s),
          ((int)*pcVar4 & 0xc0U) != 0x80)))) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar2 = read_UTF8_ch(pcVar4);
      if (iVar2 < 0x800) {
        return ENC_SINGLE_BYTE;
      }
      uStack_28 = uStack_28 + 3;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if ((((int)*pcVar4 & 0xf8U) != 0xf0) ||
       (((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s),
         ((int)*pcVar4 & 0xc0U) != 0x80 ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s),
         ((int)*pcVar4 & 0xc0U) != 0x80)) ||
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s), ((int)*pcVar4 & 0xc0U) != 0x80
        )))) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)s);
    iVar2 = read_UTF8_ch(pcVar4);
    if ((iVar2 < 0x10000) || (0x10ffff < iVar2)) {
      return ENC_SINGLE_BYTE;
    }
    uStack_28 = uStack_28 + 4;
  }
  return ENC_SINGLE_BYTE;
}

Assistant:

encoding_t detect_encoding(const str& s) {
    bool anyhigh = false;
    for (size_t i = 0; i < s.size();) {
        if ((s[i] & 0x80) == 0) {
            i += 1;
            continue;
        }
        anyhigh = true;
        if ((s[i] & 0xE0) == 0xC0 && (s[i + 1] & 0xC0) == 0x80) {
            if (read_UTF8_ch(&s[i]) < 0x80)
                return ENC_SINGLE_BYTE;
            i += 2;
        } else if ((s[i] & 0xF0) == 0xE0 && (s[i + 1] & 0xC0) == 0x80 && (s[i + 2] & 0xC0) == 0x80) {
            if (read_UTF8_ch(&s[i]) < 0x800)
                return ENC_SINGLE_BYTE;
            i += 3;
        } else if ((s[i] & 0xF8) == 0xF0 && (s[i + 1] & 0xC0) == 0x80 && (s[i + 2] & 0xC0) == 0x80 && (s[i + 3] & 0xC0) == 0x80) {
            int c = read_UTF8_ch(&s[i]);
            if (c < 0x10000 || c > 0x10FFFF)
                return ENC_SINGLE_BYTE;
            i += 4;
        } else {
            return ENC_SINGLE_BYTE;
        }
    }
    return anyhigh ? ENC_UTF8 : ENC_ASCII;
}